

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::EOITestInst<true>::Exec
          (EOITestInst<true> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint uVar1;
  
  uVar1 = *inputOffset;
  if (uVar1 < inputLength) {
    if (matcher->w != (DebugWriter *)0x0) {
      DebugWriter::PrintEOL(matcher->w,L"CLEAR");
    }
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = 0;
    (assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = 0;
  }
  else {
    *instPointer = *instPointer + 1;
  }
  return uVar1 < inputLength;
}

Assistant:

inline bool EOITestInst<canHardFail>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (inputOffset < inputLength)
        {
            if (canHardFail)
            {
                // We know backtracking can never take us later in the input, but starting from later in the input could help
                return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::LaterOnly));
            }
            else
            {
                return matcher.Fail(FAIL_PARAMETERS);
            }
        }
        instPointer += sizeof(*this);
        return false;
    }